

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMeshSolution.cpp
# Opt level: O1

void __thiscall
TPZMeshSolution::Execute
          (TPZMeshSolution *this,TPZVec<double> *x,TPZVec<double> *f,TPZFMatrix<double> *df)

{
  TPZManVector<double,_3> *qsi;
  double *pdVar1;
  TPZCompEl *pTVar2;
  TPZGeoEl **ppTVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  TPZManVector<double,_10> dsol;
  TPZManVector<double,_10> sol;
  TPZManVector<double,_3> local_148;
  TPZManVector<double,_10> local_110;
  TPZManVector<double,_10> local_a0;
  
  local_148.super_TPZVec<double>.fStore = (double *)0x0;
  local_148.super_TPZVec<double>.fNElements = 0;
  local_148.super_TPZVec<double>.fNAlloc = 0;
  local_148.super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841aa0;
  uVar6 = x->fNElements;
  if ((long)uVar6 < 4) {
    local_148.super_TPZVec<double>.fStore = local_148.fExtAlloc;
    local_148.super_TPZVec<double>.fNAlloc = 0;
  }
  else {
    local_148.super_TPZVec<double>.fStore =
         (double *)operator_new__(-(ulong)(uVar6 >> 0x3d != 0) | uVar6 * 8);
    local_148.super_TPZVec<double>.fNAlloc = uVar6;
  }
  if (0 < (long)uVar6) {
    pdVar1 = x->fStore;
    uVar5 = 0;
    do {
      local_148.super_TPZVec<double>.fStore[uVar5] = pdVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  qsi = &this->fLastLoc;
  local_148.super_TPZVec<double>.fNElements = uVar6;
  TPZGeoMesh::FindElement
            (this->fMesh->fReference,&local_148.super_TPZVec<double>,&qsi->super_TPZVec<double>,
             &this->fGeoElIndex,this->fDimension);
  ppTVar3 = TPZChunkVector<TPZGeoEl_*,_10>::operator[]
                      (&(this->fMesh->fReference->fElementVec).super_TPZChunkVector<TPZGeoEl_*,_10>,
                       this->fGeoElIndex);
  pTVar2 = (*ppTVar3)->fReference;
  TPZManVector<double,_10>::TPZManVector(&local_a0,1);
  TPZManVector<double,_10>::TPZManVector(&local_110,3);
  (**(code **)(*(long *)pTVar2 + 0x1b0))(pTVar2,qsi,this->fSolutionVarindex,&local_a0);
  (**(code **)(*(long *)pTVar2 + 0x1b0))(pTVar2,qsi,this->fGradVarindex,&local_110);
  lVar7 = (df->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  lVar4 = 3;
  if (lVar7 < 3) {
    lVar4 = lVar7;
  }
  if (0 < this->fNumSolutions) {
    lVar9 = 0;
    lVar7 = 0;
    lVar8 = 0;
    do {
      f->fStore[lVar8] = local_a0.super_TPZVec<double>.fStore[lVar8];
      if (0 < (int)(uint)lVar4) {
        uVar6 = 0;
        do {
          if (((df->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar6) ||
             ((df->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= lVar8)) {
            TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
            pzinternal::DebugStopImpl
                      ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                       ,0x26d);
          }
          *(undefined8 *)
           ((long)df->fElem +
           uVar6 * 8 + (df->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * lVar9) =
               *(undefined8 *)((long)local_110.super_TPZVec<double>.fStore + uVar6 * 8 + lVar7);
          uVar6 = uVar6 + 1;
        } while (((uint)lVar4 & 0x7fffffff) != uVar6);
      }
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x18;
      lVar9 = lVar9 + 8;
    } while (lVar8 < this->fNumSolutions);
  }
  TPZManVector<double,_10>::~TPZManVector(&local_110);
  TPZManVector<double,_10>::~TPZManVector(&local_a0);
  TPZManVector<double,_3>::~TPZManVector(&local_148);
  return;
}

Assistant:

void TPZMeshSolution::Execute(const TPZVec<REAL> &x, TPZVec<STATE> &f, TPZFMatrix<STATE> &df)
{
    TPZManVector<REAL,3> xcopy(x);
    fMesh->Reference()->FindElement(xcopy, fLastLoc, fGeoElIndex, fDimension);
    TPZGeoEl *gel = fMesh->Reference()->Element(fGeoElIndex);
    TPZCompEl *cel = gel->Reference();
    TPZManVector<STATE> sol(1), dsol(3);
    cel->Solution(fLastLoc,fSolutionVarindex,sol);
    cel->Solution(fLastLoc,fGradVarindex,dsol);
    int maxd = 3;
    if (df.Rows() < 3) {
        maxd = df.Rows();
    }
    for (int is=0; is<fNumSolutions; is++) {
        f[is] = sol[is];
        for (int d=0; d<maxd; d++) {
            df(d,is) = dsol[is*3+d];
        }
    }
}